

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float64_primitive_asInt8
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_float64_t sVar2;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar2 = sysbvm_tuple_float64_decode(*arguments);
  sVar1 = sysbvm_tuple_int8_encode((int8_t)(int)(double)sVar2);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asInt8(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_int8_encode((int8_t)sysbvm_tuple_float64_decode(arguments[0]));
}